

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<long,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase1
               (uint lhs,
               SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  bool bVar1;
  long lVar2;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX;
  long in_RSI;
  uint in_EDI;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffb0;
  long local_48;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_40;
  long local_38;
  long local_30;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_28;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *local_20;
  uint local_14;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_10;
  
  local_20 = in_RDX;
  local_14 = in_EDI;
  local_10.m_int = in_RSI;
  lVar2 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
  if (lVar2 < 1) {
    lVar2 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
    if (lVar2 == 0) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
    }
    local_38 = local_10.m_int;
    bVar1 = DivisionNegativeCornerCaseHelper<long,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::NegativeCornerCase(local_14,local_10,local_20);
    if (!bVar1) {
      local_48 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
      local_48 = (long)(ulong)local_14 / local_48;
      SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_40,&local_48);
      local_20->m_int = local_40.m_int;
    }
  }
  else {
    this = (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
           (ulong)local_14;
    local_30 = ::SafeInt::operator_cast_to_long(this);
    local_30 = (long)this / local_30;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_28,&local_30);
    local_20->m_int = local_28.m_int;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }